

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppwriteinitialization.cpp
# Opt level: O3

QString * CPP::WriteInitialization::domColor2QString(QString *__return_storage_ptr__,DomColor *c)

{
  int iVar1;
  long in_FS_OFFSET;
  QByteArrayView QVar2;
  QByteArrayView QVar3;
  QArrayData *local_88 [3];
  QArrayData *local_70 [3];
  QArrayData *local_58 [3];
  QArrayData *local_40 [3];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (c->m_has_attr_alpha == true) {
    QVar2.m_data = (storage_type *)0x16;
    QVar2.m_size = (qsizetype)local_88;
    QString::fromLatin1(QVar2);
    QString::arg_impl((longlong)local_70,(int)local_88,c->m_red,(QChar)0x0);
    QString::arg_impl((longlong)local_58,(int)local_70,c->m_green,(QChar)0x0);
    QString::arg_impl((longlong)local_40,(int)local_58,c->m_blue,(QChar)0x0);
    QString::arg_impl((longlong)__return_storage_ptr__,(int)local_40,c->m_attr_alpha,(QChar)0x0);
    if (local_40[0] != (QArrayData *)0x0) {
      LOCK();
      (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_40[0],2,0x10);
      }
    }
    if (local_58[0] != (QArrayData *)0x0) {
      LOCK();
      (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58[0],2,0x10);
      }
    }
    if (local_70[0] != (QArrayData *)0x0) {
      LOCK();
      (local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_70[0],2,0x10);
      }
    }
    if (local_88[0] == (QArrayData *)0x0) goto LAB_0012ccea;
    LOCK();
    (local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    iVar1 = (local_88[0]->ref_)._q_value.super___atomic_base<int>._M_i;
    UNLOCK();
    local_70[0] = local_88[0];
  }
  else {
    QVar3.m_data = (storage_type *)0x12;
    QVar3.m_size = (qsizetype)local_70;
    QString::fromLatin1(QVar3);
    QString::arg_impl((longlong)local_58,(int)local_70,c->m_red,(QChar)0x0);
    QString::arg_impl((longlong)local_40,(int)local_58,c->m_green,(QChar)0x0);
    QString::arg_impl((longlong)__return_storage_ptr__,(int)local_40,c->m_blue,(QChar)0x0);
    if (local_40[0] != (QArrayData *)0x0) {
      LOCK();
      (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_40[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_40[0],2,0x10);
      }
    }
    if (local_58[0] != (QArrayData *)0x0) {
      LOCK();
      (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58[0],2,0x10);
      }
    }
    if (local_70[0] == (QArrayData *)0x0) goto LAB_0012ccea;
    LOCK();
    (local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    iVar1 = (local_70[0]->ref_)._q_value.super___atomic_base<int>._M_i;
    UNLOCK();
  }
  if (iVar1 == 0) {
    QArrayData::deallocate(local_70[0],2,0x10);
  }
LAB_0012ccea:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString WriteInitialization::domColor2QString(const DomColor *c)
{
    if (c->hasAttributeAlpha())
        return QString::fromLatin1("QColor(%1, %2, %3, %4)")
            .arg(c->elementRed())
            .arg(c->elementGreen())
            .arg(c->elementBlue())
            .arg(c->attributeAlpha());
    return QString::fromLatin1("QColor(%1, %2, %3)")
        .arg(c->elementRed())
        .arg(c->elementGreen())
        .arg(c->elementBlue());
}